

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O3

dict_insert_result wb_tree_insert(wb_tree *tree,void *key)

{
  wb_node *pwVar1;
  dict_compare_func p_Var2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  wb_node *pwVar9;
  size_t sVar10;
  dict_compare_func p_Var11;
  void **ppvVar12;
  int iVar13;
  long lVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar15;
  ulong uVar16;
  void *key_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int iVar17;
  int iVar18;
  wb_tree *tree_00;
  int iVar19;
  void **ppvVar20;
  wb_node *n;
  dict_insert_result dVar21;
  dict_insert_result dVar22;
  dict_insert_result dVar23;
  
  pwVar9 = tree->root;
  if (tree->root == (wb_node *)0x0) {
    lVar14 = 0x20;
    n = (wb_node *)0x0;
    tree_00 = (wb_tree *)key;
  }
  else {
    do {
      n = pwVar9;
      tree_00 = (wb_tree *)n->key;
      uVar7 = (*tree->cmp_func)(key,tree_00);
      if ((int)uVar7 < 0) {
        lVar14 = 0x18;
      }
      else {
        lVar14 = 0x20;
        if (uVar7 == 0) {
          ppvVar20 = &n->datum;
          uVar15 = 0;
          goto LAB_00106607;
        }
      }
      pwVar9 = *(wb_node **)((long)&n->key + lVar14);
    } while (pwVar9 != (wb_node *)0x0);
    lVar14 = (ulong)(~uVar7 >> 0x1f) * 8 + 0x18;
  }
  ppvVar20 = (void **)0x30;
  pwVar9 = (wb_node *)(*dict_malloc_func)(0x30);
  if (pwVar9 == (wb_node *)0x0) {
    ppvVar20 = (void **)0x0;
    uVar15 = 0;
    goto LAB_00106607;
  }
  pwVar9->key = key;
  pwVar9->datum = (void *)0x0;
  pwVar9->parent = (wb_node *)0x0;
  pwVar9->llink = (wb_node *)0x0;
  pwVar9->rlink = (wb_node *)0x0;
  pwVar9->weight = 2;
  pwVar9->parent = n;
  if (n != (wb_node *)0x0) {
    *(wb_node **)((long)&n->key + lVar14) = pwVar9;
    uVar7 = 0;
    do {
      pwVar1 = n->parent;
      n->weight = n->weight + 1;
      uVar8 = fixup(tree,n);
      uVar7 = uVar7 + uVar8;
      n = pwVar1;
    } while (pwVar1 != (wb_node *)0x0);
    tree->rotation_count = tree->rotation_count + (ulong)uVar7;
    sVar10 = tree->count + 1;
    uVar15 = extraout_RDX_00;
LAB_001065fd:
    ppvVar20 = &pwVar9->datum;
    tree->count = sVar10;
    uVar15 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
LAB_00106607:
    dVar21._8_8_ = uVar15;
    dVar21.datum_ptr = ppvVar20;
    return dVar21;
  }
  if (tree->count == 0) {
    if (tree->root == (wb_node *)0x0) {
      tree->root = pwVar9;
      sVar10 = 1;
      uVar15 = extraout_RDX;
      goto LAB_001065fd;
    }
  }
  else {
    wb_tree_insert_cold_1();
  }
  wb_tree_insert_cold_2();
  sVar10 = tree_00->rotation_count;
  if (sVar10 == 0) {
    uVar7 = 1000;
  }
  else {
    uVar7 = *(int *)(sVar10 + 0x28) * 1000;
  }
  iVar18 = (int)tree_00[1].count;
  if (uVar7 < (uint)(iVar18 * 0x125)) {
    lVar14 = (long)tree_00[1].root;
    if (lVar14 != 0) {
      p_Var11 = *(dict_compare_func *)(lVar14 + 0x18);
      if (p_Var11 == (dict_compare_func)0x0) {
        if ((uint)(*(int *)(lVar14 + 0x28) * 0x24a) < 0x3e9) goto LAB_001068d4;
      }
      else if ((uint)(*(int *)(lVar14 + 0x28) * 0x24a) <= (uint)(*(int *)(p_Var11 + 0x28) * 1000)) {
        p_Var2 = tree_00->cmp_func;
        *(dict_compare_func *)(p_Var11 + 0x10) = p_Var2;
        if (p_Var2 != (dict_compare_func)0x0) {
          ppvVar20 = (void **)(p_Var2 + 0x20);
          if (*(wb_tree **)(p_Var2 + 0x18) == tree_00) {
            ppvVar20 = (void **)(p_Var2 + 0x18);
          }
        }
        *ppvVar20 = p_Var11;
        lVar3 = *(long *)(p_Var11 + 0x18);
        *(wb_tree **)(p_Var11 + 0x18) = tree_00;
        tree_00->cmp_func = p_Var11;
        tree_00[1].root = (wb_node *)lVar3;
        if (lVar3 != 0) {
          *(wb_tree **)(lVar3 + 0x10) = tree_00;
        }
        lVar4 = *(long *)(p_Var11 + 0x20);
        *(long *)(p_Var11 + 0x20) = lVar14;
        *(dict_compare_func *)(lVar14 + 0x10) = p_Var11;
        *(long *)(lVar14 + 0x18) = lVar4;
        if (lVar4 != 0) {
          *(long *)(lVar4 + 0x10) = lVar14;
        }
        iVar13 = 1;
        iVar18 = 1;
        if (tree_00->rotation_count != 0) {
          iVar18 = *(int *)(tree_00->rotation_count + 0x28);
        }
        if (lVar3 != 0) {
          iVar13 = *(int *)(lVar3 + 0x28);
        }
        *(int *)&tree_00[1].count = iVar13 + iVar18;
        iVar17 = 1;
        iVar19 = 1;
        if (lVar4 != 0) {
          iVar19 = *(int *)(lVar4 + 0x28);
        }
        uVar16 = *(ulong *)(lVar14 + 0x20);
        if (uVar16 != 0) {
          iVar17 = *(int *)(uVar16 + 0x28);
        }
        *(int *)(lVar14 + 0x28) = iVar17 + iVar19;
        iVar18 = iVar17 + iVar19 + iVar13 + iVar18;
LAB_001068b2:
        *(int *)(p_Var11 + 0x28) = iVar18;
        ppvVar12 = (void **)0x2;
        goto LAB_001068ba;
      }
      tree_node_rot_left(ppvVar20,tree_00);
      iVar13 = 1;
      iVar18 = 1;
      if (tree_00->rotation_count != 0) {
        iVar18 = *(int *)(tree_00->rotation_count + 0x28);
      }
      if (tree_00[1].root != (wb_node *)0x0) {
        iVar13 = *(int *)((long)tree_00[1].root + 0x28);
      }
      *(int *)&tree_00[1].count = iVar13 + iVar18;
      ppvVar12 = (void **)0x1;
      iVar19 = 1;
      if (*(long *)(lVar14 + 0x20) != 0) {
        iVar19 = *(int *)(*(long *)(lVar14 + 0x20) + 0x28);
      }
      uVar7 = iVar19 + iVar13 + iVar18;
      uVar16 = (ulong)uVar7;
      *(uint *)(lVar14 + 0x28) = uVar7;
LAB_001068ba:
      dVar22._8_8_ = uVar16;
      dVar22.datum_ptr = ppvVar12;
      return dVar22;
    }
    fixup_cold_4();
LAB_001068ca:
    fixup_cold_2();
  }
  else {
    uVar8 = iVar18 * 0x2c3;
    uVar16 = (ulong)uVar8;
    ppvVar12 = (void **)0x0;
    if (uVar7 <= uVar8) goto LAB_001068ba;
    if (sVar10 == 0) goto LAB_001068ca;
    if (*(long *)(sVar10 + 0x18) == 0) {
      iVar18 = 1;
    }
    else {
      iVar18 = *(int *)(*(long *)(sVar10 + 0x18) + 0x28);
    }
    if ((uint)(*(int *)(sVar10 + 0x28) * 0x19e) < (uint)(iVar18 * 1000)) {
      tree_node_rot_right(ppvVar20,tree_00);
      iVar19 = 1;
      iVar13 = 1;
      if (tree_00->rotation_count != 0) {
        iVar13 = *(int *)(tree_00->rotation_count + 0x28);
      }
      uVar16 = (ulong)tree_00[1].root;
      if (uVar16 != 0) {
        iVar19 = *(int *)(uVar16 + 0x28);
      }
      *(int *)&tree_00[1].count = iVar19 + iVar13;
      *(int *)(sVar10 + 0x28) = iVar19 + iVar13 + iVar18;
      ppvVar12 = (void **)0x1;
      goto LAB_001068ba;
    }
    p_Var11 = *(dict_compare_func *)(sVar10 + 0x20);
    if (p_Var11 != (dict_compare_func)0x0) {
      p_Var2 = tree_00->cmp_func;
      *(dict_compare_func *)(p_Var11 + 0x10) = p_Var2;
      if (p_Var2 != (dict_compare_func)0x0) {
        ppvVar20 = (void **)(p_Var2 + 0x20);
        if (*(wb_tree **)(p_Var2 + 0x18) == tree_00) {
          ppvVar20 = (void **)(p_Var2 + 0x18);
        }
      }
      *ppvVar20 = p_Var11;
      lVar14 = *(long *)(p_Var11 + 0x18);
      *(size_t *)(p_Var11 + 0x18) = sVar10;
      *(dict_compare_func *)(sVar10 + 0x10) = p_Var11;
      *(long *)(sVar10 + 0x20) = lVar14;
      if (lVar14 != 0) {
        *(size_t *)(lVar14 + 0x10) = sVar10;
      }
      sVar5 = *(size_t *)(p_Var11 + 0x20);
      *(wb_tree **)(p_Var11 + 0x20) = tree_00;
      tree_00->cmp_func = p_Var11;
      tree_00->rotation_count = sVar5;
      iVar13 = 1;
      iVar18 = 1;
      if (sVar5 != 0) {
        *(wb_tree **)(sVar5 + 0x10) = tree_00;
        iVar18 = *(int *)(sVar5 + 0x28);
      }
      if (tree_00[1].root != (wb_node *)0x0) {
        iVar13 = *(int *)((long)tree_00[1].root + 0x28);
      }
      uVar7 = iVar13 + iVar18;
      uVar16 = (ulong)uVar7;
      *(uint *)&tree_00[1].count = uVar7;
      iVar13 = 1;
      iVar18 = 1;
      if (*(long *)(sVar10 + 0x18) != 0) {
        iVar18 = *(int *)(*(long *)(sVar10 + 0x18) + 0x28);
      }
      if (lVar14 != 0) {
        iVar13 = *(int *)(lVar14 + 0x28);
      }
      *(int *)(sVar10 + 0x28) = iVar13 + iVar18;
      iVar18 = iVar13 + iVar18 + uVar7;
      goto LAB_001068b2;
    }
  }
  fixup_cold_1();
LAB_001068d4:
  fixup_cold_3();
  pwVar9 = (wb_node *)tree_search_node(tree_00,key_00);
  if (pwVar9 == (wb_node *)0x0) {
    *ppvVar20 = (void *)0x0;
    ppvVar20[1] = (void *)0x0;
    ppvVar20[2] = (void *)0x0;
    uVar15 = extraout_RDX_01;
  }
  else {
    pvVar6 = pwVar9->datum;
    *ppvVar20 = pwVar9->key;
    ppvVar20[1] = pvVar6;
    *(code *)(ppvVar20 + 2) = (code)0x1;
    remove_node(tree_00,pwVar9);
    uVar15 = extraout_RDX_02;
  }
  dVar23._8_8_ = uVar15;
  dVar23.datum_ptr = ppvVar20;
  return dVar23;
}

Assistant:

dict_insert_result
wb_tree_insert(wb_tree* tree, void* key)
{
    int cmp = 0;

    wb_node* node = tree->root;
    wb_node* parent = NULL;
    while (node) {
	cmp = tree->cmp_func(key, node->key);
	if (cmp < 0) {
	    parent = node; node = node->llink;
	} else if (cmp) {
	    parent = node; node = node->rlink;
	} else
	    return (dict_insert_result) { &node->datum, false };
    }

    wb_node* const add = node = node_new(key);
    if (!add)
	return (dict_insert_result) { NULL, false };

    if (!(node->parent = parent)) {
	ASSERT(tree->count == 0);
	ASSERT(tree->root == NULL);
	tree->root = node;
    } else {
	if (cmp < 0)
	    parent->llink = node;
	else
	    parent->rlink = node;

	unsigned rotations = 0;
	while ((node = parent) != NULL) {
	    parent = node->parent;
	    ++node->weight;
	    rotations += fixup(tree, node);
	}
	tree->rotation_count += rotations;
    }
    tree->count++;
    return (dict_insert_result) { &add->datum, true };
}